

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

Vector<float,_4> __thiscall tcu::Vector<float,_3>::toWidth<4>(Vector<float,_3> *this)

{
  float fVar1;
  long lVar2;
  long in_RSI;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar4;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar1 = *(float *)(in_RSI + lVar2 * 4);
    uVar3 = (ulong)(uint)fVar1;
    this->m_data[lVar2] = fVar1;
  }
  this[1].m_data[0] = 0.0;
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}